

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridSpecs.hpp
# Opt level: O2

void __thiscall sciplot::GridSpecs::GridSpecs(GridSpecs *this)

{
  allocator<char> local_39;
  string local_38;
  
  *(undefined ***)&(this->super_GridSpecsBase).super_LineSpecsOf<sciplot::GridSpecsBase> =
       &PTR__Specs_001adea8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  GridSpecsBase::GridSpecsBase(&this->super_GridSpecsBase,&PTR_PTR_001acd50,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&(this->super_GridSpecsBase).super_LineSpecsOf<sciplot::GridSpecsBase> =
       &PTR__GridSpecs_001accb0;
  *(undefined ***)&(this->super_GridSpecsBase).super_DepthSpecsOf<sciplot::GridSpecsBase> =
       &PTR__GridSpecs_001accf0;
  *(undefined ***)&(this->super_GridSpecsBase).super_ShowSpecsOf<sciplot::GridSpecsBase> =
       &PTR__GridSpecs_001acd30;
  (this->m_gridticsspecs).
  super__Vector_base<sciplot::GridSpecsBase,_std::allocator<sciplot::GridSpecsBase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_gridticsspecs).
  super__Vector_base<sciplot::GridSpecsBase,_std::allocator<sciplot::GridSpecsBase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_gridticsspecs).
  super__Vector_base<sciplot::GridSpecsBase,_std::allocator<sciplot::GridSpecsBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GridSpecsBase).super_ShowSpecsOf<sciplot::GridSpecsBase>.m_show = false;
  DepthSpecsOf<sciplot::GridSpecsBase>::back
            (&(this->super_GridSpecsBase).super_DepthSpecsOf<sciplot::GridSpecsBase>);
  return;
}

Assistant:

inline GridSpecs::GridSpecs()
: GridSpecsBase("", true)
{
    show(false);
    back();
}